

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

string * ItemSerialize(string *__return_storage_ptr__,
                      list<Character_Item,_std::allocator<Character_Item>_> *list)

{
  bool bVar1;
  pointer pCVar2;
  int subject;
  int subject_00;
  string local_80;
  string local_60;
  _Self local_40 [3];
  _Self local_28;
  const_iterator item;
  list<Character_Item,_std::allocator<Character_Item>_> *list_local;
  string *serialized;
  
  item._M_node._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_28._M_node =
       (_List_node_base *)
       util::cbegin<std::__cxx11::list<Character_Item,std::allocator<Character_Item>>>(list);
  while( true ) {
    local_40[0]._M_node =
         (_List_node_base *)
         util::cend<std::__cxx11::list<Character_Item,std::allocator<Character_Item>>>(list);
    bVar1 = std::operator!=(&local_28,local_40);
    if (!bVar1) break;
    pCVar2 = std::_List_const_iterator<Character_Item>::operator->(&local_28);
    util::to_string_abi_cxx11_(&local_60,(util *)(ulong)(uint)(int)pCVar2->id,subject);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pCVar2 = std::_List_const_iterator<Character_Item>::operator->(&local_28);
    util::to_string_abi_cxx11_(&local_80,(util *)(ulong)(uint)pCVar2->amount,subject_00);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::_List_const_iterator<Character_Item>::operator++(&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ItemSerialize(const std::list<Character_Item> &list)
{
	std::string serialized;

	UTIL_CIFOREACH(list, item)
	{
		serialized.append(util::to_string(item->id));
		serialized.append(",");
		serialized.append(util::to_string(item->amount));
		serialized.append(";");
	}

	return serialized;
}